

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

const_iterator __thiscall VarnodeBank::beginDef(VarnodeBank *this,uint4 fl,Address *addr)

{
  const_iterator cVar1;
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  if (fl == 8) {
    local_38._M_dataplus._M_p = (pointer)&this->searchvn;
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    cVar1._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareDefLoc,_std::allocator<Varnode_*>_>
         ::lower_bound(&(this->def_tree)._M_t,(key_type *)&local_38);
  }
  else {
    if (fl == 0x10) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_38,"Cannot get contiguous written AND addressed",&local_39);
      LowlevelError::LowlevelError(this_00,&local_38);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    (this->searchvn).flags = 0;
    local_38._M_dataplus._M_p = (pointer)&this->searchvn;
    cVar1._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareDefLoc,_std::allocator<Varnode_*>_>
         ::upper_bound(&(this->def_tree)._M_t,(key_type *)&local_38);
    (this->searchvn).flags = 8;
  }
  return (const_iterator)cVar1._M_node;
}

Assistant:

VarnodeDefSet::const_iterator VarnodeBank::beginDef(uint4 fl,const Address &addr) const

{				// Get varnodes with addr and with definition type
  VarnodeDefSet::const_iterator iter;

  if (fl == Varnode::written)
    throw LowlevelError("Cannot get contiguous written AND addressed");
  else if (fl == Varnode::input) {
    searchvn.loc = addr;
    iter = def_tree.lower_bound(&searchvn);
    return iter;
  }

  // Find the start of the frees with a given address
  searchvn.loc = addr;
  searchvn.flags = 0;
				// Since a size 0 object shouldn't exist, an upper bound
				// should bump up to first free of addr with non-zero size
  iter = def_tree.upper_bound(&searchvn);
  searchvn.flags = Varnode::input; // Reset flags
  return iter;
}